

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

uint llvm::ARM::parseArchVersion(StringRef Arch)

{
  ArchKind AVar1;
  size_t in_RDX;
  StringRef SVar2;
  StringRef Arch_local;
  uint local_c;
  
  SVar2.Data = (char *)Arch.Length;
  SVar2.Length = in_RDX;
  SVar2 = getCanonicalArchName((ARM *)Arch.Data,SVar2);
  AVar1 = parseArch(SVar2);
  switch(AVar1) {
  case INVALID:
    local_c = 0;
    break;
  case ARMV2:
  case ARMV2A:
    local_c = 2;
    break;
  case ARMV3:
  case ARMV3M:
    local_c = 3;
    break;
  case ARMV4:
  case ARMV4T:
    local_c = 4;
    break;
  case ARMV5T:
  case ARMV5TE:
  case ARMV5TEJ:
  case IWMMXT:
  case IWMMXT2:
  case XSCALE:
    local_c = 5;
    break;
  case ARMV6:
  case ARMV6K:
  case ARMV6T2:
  case ARMV6KZ:
  case ARMV6M:
    local_c = 6;
    break;
  case ARMV7A:
  case ARMV7VE:
  case ARMV7R:
  case ARMV7M:
  case ARMV7EM:
  case ARMV7S:
  case ARMV7K:
    local_c = 7;
    break;
  case ARMV8A:
  case ARMV8_1A:
  case ARMV8_2A:
  case ARMV8_3A:
  case ARMV8_4A:
  case ARMV8R:
  case ARMV8MBaseline:
  case ARMV8MMainline:
    local_c = 8;
    break;
  default:
    llvm_unreachable_internal
              ("Unhandled architecture",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/TargetParser.cpp"
               ,0x348);
  }
  return local_c;
}

Assistant:

unsigned llvm::ARM::parseArchVersion(StringRef Arch) {
  Arch = getCanonicalArchName(Arch);
  switch (parseArch(Arch)) {
  case ARM::ArchKind::ARMV2:
  case ARM::ArchKind::ARMV2A:
    return 2;
  case ARM::ArchKind::ARMV3:
  case ARM::ArchKind::ARMV3M:
    return 3;
  case ARM::ArchKind::ARMV4:
  case ARM::ArchKind::ARMV4T:
    return 4;
  case ARM::ArchKind::ARMV5T:
  case ARM::ArchKind::ARMV5TE:
  case ARM::ArchKind::IWMMXT:
  case ARM::ArchKind::IWMMXT2:
  case ARM::ArchKind::XSCALE:
  case ARM::ArchKind::ARMV5TEJ:
    return 5;
  case ARM::ArchKind::ARMV6:
  case ARM::ArchKind::ARMV6K:
  case ARM::ArchKind::ARMV6T2:
  case ARM::ArchKind::ARMV6KZ:
  case ARM::ArchKind::ARMV6M:
    return 6;
  case ARM::ArchKind::ARMV7A:
  case ARM::ArchKind::ARMV7VE:
  case ARM::ArchKind::ARMV7R:
  case ARM::ArchKind::ARMV7M:
  case ARM::ArchKind::ARMV7S:
  case ARM::ArchKind::ARMV7EM:
  case ARM::ArchKind::ARMV7K:
    return 7;
  case ARM::ArchKind::ARMV8A:
  case ARM::ArchKind::ARMV8_1A:
  case ARM::ArchKind::ARMV8_2A:
  case ARM::ArchKind::ARMV8_3A:
  case ARM::ArchKind::ARMV8_4A:
  case ARM::ArchKind::ARMV8R:
  case ARM::ArchKind::ARMV8MBaseline:
  case ARM::ArchKind::ARMV8MMainline:
    return 8;
  case ARM::ArchKind::INVALID:
    return 0;
  }
  llvm_unreachable("Unhandled architecture");
}